

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

void __thiscall QNetworkRequest::setAttribute(QNetworkRequest *this,Attribute code,QVariant *value)

{
  bool bVar1;
  QNetworkRequestPrivate *pQVar2;
  Attribute *in_RDI;
  long in_FS_OFFSET;
  QVariant *in_stack_ffffffffffffffd0;
  char local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QVariant::isValid(in_stack_ffffffffffffffd0);
  if (bVar1) {
    QSharedDataPointer<QNetworkRequestPrivate>::operator->
              ((QSharedDataPointer<QNetworkRequestPrivate> *)in_stack_ffffffffffffffd0);
    QHash<QNetworkRequest::Attribute,_QVariant>::insert
              ((QHash<QNetworkRequest::Attribute,_QVariant> *)in_stack_ffffffffffffffd0,in_RDI,
               (QVariant *)0x1f2a90);
  }
  else {
    pQVar2 = QSharedDataPointer<QNetworkRequestPrivate>::operator->
                       ((QSharedDataPointer<QNetworkRequestPrivate> *)in_stack_ffffffffffffffd0);
    QHash<QNetworkRequest::Attribute,_QVariant>::remove
              (&(pQVar2->super_QNetworkHeadersPrivate).attributes,local_c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkRequest::setAttribute(Attribute code, const QVariant &value)
{
    if (value.isValid())
        d->attributes.insert(code, value);
    else
        d->attributes.remove(code);
}